

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Eigen_Colamd.h
# Opt level: O2

int Eigen::internal::clear_mark<int>(int n_row,Colamd_Row<int> *Row)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = 0;
  uVar2 = (ulong)(uint)n_row;
  if (n_row < 1) {
    uVar2 = uVar1;
  }
  for (; uVar2 * 0x10 != uVar1; uVar1 = uVar1 + 0x10) {
    if (-1 < *(int *)((long)&Row->shared2 + uVar1)) {
      *(undefined4 *)((long)&Row->shared2 + uVar1) = 0;
    }
  }
  return (int)uVar1;
}

Assistant:

static inline  Index clear_mark  /* return the new value for tag_mark */
  (
      /* === Parameters ======================================================= */

    Index n_row,    /* number of rows in A */
    Colamd_Row<Index> Row [] /* Row [0 ... n_row-1].shared2.mark is set to zero */
    )
{
  /* === Local variables ================================================== */

  Index r ;

  for (r = 0 ; r < n_row ; r++)
  {
    if (ROW_IS_ALIVE (r))
    {
      Row [r].shared2.mark = 0 ;
    }
  }
  return (1) ;
}